

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                   (char *fmt,
                   _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                   *args)

{
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *args_00;
  char *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_180 [23];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = local_180;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)args_00);
  format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,args_00);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}